

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O0

int __thiscall Process::open(Process *this,char *__file,int __oflag,...)

{
  long lVar1;
  Process *this_00;
  int iVar2;
  int *piVar3;
  long lVar4;
  String *pSVar5;
  int *extraout_RAX;
  ulong uVar6;
  undefined8 uStack_140;
  undefined8 uStack_138;
  String *local_130;
  char *local_128;
  String *local_120;
  undefined1 local_111;
  Iterator *local_110;
  Iterator *local_108;
  usize local_100;
  undefined1 local_f1;
  List<String> *local_f0;
  Process *local_e8;
  Iterator local_e0;
  Iterator end;
  Iterator j;
  int i;
  char **argv;
  undefined1 local_88 [8];
  List<String> command;
  uint streams_local;
  String *commandLine_local;
  Process *this_local;
  
  local_e8 = this;
  command.blocks._4_4_ = __oflag;
  if (this->pid == 0) {
    local_f0 = (List<String> *)local_88;
    uStack_140 = 0x119feb;
    List<String>::List(local_f0);
    uStack_140 = 0x119ffb;
    Private::splitCommandLine((String *)__file,local_f0);
    uStack_140 = 0x11a006;
    local_f1 = List<String>::isEmpty((List<String> *)local_88);
    if ((bool)local_f1) {
      uStack_140 = 0x11a026;
      String::String((String *)&argv);
      uStack_140 = 0x11a038;
      List<String>::append((List<String> *)local_88,(String *)&argv);
      uStack_140 = 0x11a046;
      String::~String((String *)&argv);
    }
    uStack_140 = 0x11a08b;
    local_100 = List<String>::size((List<String> *)local_88);
    lVar1 = -(local_100 * 8 + 0x17 & 0xfffffffffffffff0);
    lVar4 = (long)&uStack_138 + lVar1;
    j.item._4_4_ = 0;
    *(undefined8 *)((long)&uStack_140 + lVar1) = 0x11a0ca;
    local_108 = List<String>::begin((List<String> *)local_88);
    end.item = local_108->item;
    *(undefined8 *)((long)&uStack_140 + lVar1) = 0x11a0ed;
    local_110 = List<String>::end((List<String> *)local_88);
    local_e0.item = local_110->item;
    while( true ) {
      *(undefined8 *)((long)&uStack_140 + lVar1) = 0x11a11a;
      local_111 = List<String>::Iterator::operator!=(&end,&local_e0);
      if (!(bool)local_111) break;
      *(undefined8 *)((long)&uStack_140 + lVar1) = 0x11a13a;
      pSVar5 = List<String>::Iterator::operator*(&end);
      local_120 = pSVar5;
      *(undefined8 *)((long)&uStack_140 + lVar1) = 0x11a14f;
      local_128 = String::operator_cast_to_char_(pSVar5);
      *(char **)(lVar4 + (long)j.item._4_4_ * 8) = local_128;
      *(undefined8 *)((long)&uStack_140 + lVar1) = 0x11a18a;
      List<String>::Iterator::operator++(&end);
      j.item._4_4_ = j.item._4_4_ + 1;
    }
    *(undefined8 *)(lVar4 + (long)j.item._4_4_ * 8) = 0;
    *(undefined8 *)((long)&uStack_140 + lVar1) = 0x11a1b0;
    pSVar5 = List<String>::front((List<String> *)local_88);
    this_00 = local_e8;
    uVar6 = (ulong)command.blocks._4_4_;
    local_130 = pSVar5;
    *(undefined8 *)((long)&uStack_140 + lVar1) = 0x11a1df;
    iVar2 = open(this_00,(char *)pSVar5,j.item._4_4_ + 1,lVar4,uVar6);
    uStack_138._7_1_ = (byte)iVar2;
    this_local._7_1_ = uStack_138._7_1_ & 1;
    *(undefined8 *)((long)&uStack_140 + lVar1) = 0x11a1fb;
    List<String>::~List((List<String> *)local_88);
    piVar3 = extraout_RAX;
  }
  else {
    uStack_140 = 0x119fcc;
    piVar3 = __errno_location();
    *piVar3 = 0x16;
    this_local._7_1_ = 0;
  }
  return (int)CONCAT71((int7)((ulong)piVar3 >> 8),this_local._7_1_);
}

Assistant:

bool Process::open(const String& commandLine, uint streams)
{
#ifdef _WIN32
  if(hProcess != INVALID_HANDLE_VALUE)
  {
    SetLastError(ERROR_INVALID_HANDLE);
    return false;
  }

  STARTUPINFO si;
  PROCESS_INFORMATION pi;

  ZeroMemory(&si, sizeof(si));
  si.cb = sizeof(si);
  ZeroMemory(&pi, sizeof(pi));

  si.dwFlags = STARTF_USESTDHANDLES;
  si.hStdInput = INVALID_HANDLE_VALUE;
  si.hStdOutput = INVALID_HANDLE_VALUE;
  si.hStdError = INVALID_HANDLE_VALUE;

  SECURITY_ATTRIBUTES sa; 
  sa.nLength = sizeof(SECURITY_ATTRIBUTES); 
  sa.bInheritHandle = TRUE; 
  sa.lpSecurityDescriptor = NULL; 

  if(streams & stdoutStream)
  {
   if(!CreatePipe(&hStdOutRead, &si.hStdOutput, &sa, 0) ||
      !SetHandleInformation(hStdOutRead, HANDLE_FLAG_INHERIT, 0))
      goto error;
  }
  else
    si.hStdOutput = GetStdHandle(STD_OUTPUT_HANDLE);
  if(streams & stderrStream)
  {
   if(!CreatePipe(&hStdErrRead, &si.hStdError, &sa, 0) ||
      !SetHandleInformation(hStdErrRead, HANDLE_FLAG_INHERIT, 0))
      goto error;
  }
  else
    si.hStdError = GetStdHandle(STD_ERROR_HANDLE);
  if(streams & stdinStream)
  {
   if(!CreatePipe(&si.hStdInput, &hStdInWrite, &sa, 0) ||
      !SetHandleInformation(hStdInWrite, HANDLE_FLAG_INHERIT, 0))
      goto error;
  }
  else
    si.hStdInput = GetStdHandle(STD_INPUT_HANDLE);

  {
    String args(commandLine);

    if(!CreateProcess(NULL, (char*)args, NULL, NULL, TRUE, 0, NULL, NULL, &si, &pi))
      goto error;
  }

  CloseHandle(pi.hThread);

  if(streams & stdoutStream && si.hStdOutput != INVALID_HANDLE_VALUE)
    CloseHandle(si.hStdOutput);
  if(streams & stderrStream && si.hStdError != INVALID_HANDLE_VALUE)
    CloseHandle(si.hStdError);
  if(streams & stdinStream && si.hStdInput != INVALID_HANDLE_VALUE)
    CloseHandle(si.hStdInput);

  ASSERT(pi.hProcess);
  hProcess = pi.hProcess;
  pid = pi.dwProcessId;
  return true;
error:
  DWORD err = GetLastError();
  if(hStdOutRead != INVALID_HANDLE_VALUE)
  {
    CloseHandle(hStdOutRead);
    hStdOutRead = INVALID_HANDLE_VALUE;
  }
  if(hStdErrRead != INVALID_HANDLE_VALUE)
  {
    CloseHandle(hStdErrRead);
    hStdErrRead = INVALID_HANDLE_VALUE;
  }
  if(hStdInWrite != INVALID_HANDLE_VALUE)
  {
    CloseHandle(hStdInWrite);
    hStdInWrite = INVALID_HANDLE_VALUE;
  }
  if(streams & stdoutStream && si.hStdOutput != INVALID_HANDLE_VALUE)
    CloseHandle(si.hStdOutput);
  if(streams & stderrStream && si.hStdError != INVALID_HANDLE_VALUE)
    CloseHandle(si.hStdError);
  if(streams & stdinStream && si.hStdInput != INVALID_HANDLE_VALUE)
    CloseHandle(si.hStdInput);
  SetLastError(err);
  return false;
#else
  if(pid)
  {
    errno = EINVAL;
    return false;
  }

  List<String> command;
  Private::splitCommandLine(commandLine, command);
  if(command.isEmpty())
    command.append(String());

  char** argv = (char**)alloca(sizeof(char*) * (command.size() + 1));
  int i = 0;
  for (List<String>::Iterator j = command.begin(), end = command.end(); j != end; ++j)
    argv[i++] = (char*)(const char*)*j;
  argv[i] = 0;
  return open(command.front(), i + 1, argv, streams);
#endif
}